

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni_cs.cpp
# Opt level: O2

wchar_t * t3_to_upper(wchar_t ch)

{
  ushort uVar1;
  wchar_t *pwVar2;
  
  if (case_tab[ch >> 7] != (case_table *)0x0) {
    uVar1 = case_tab[ch >> 7][(uint)(ch & 0x7f)].upper;
    pwVar2 = (wchar_t *)0x0;
    if (uVar1 != 0) {
      pwVar2 = case_expansion + uVar1;
    }
    return pwVar2;
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t *t3_to_upper(wchar_t ch)
{
    case_table *e = case_tab[ch >> 7];
    if (e == 0)
        return 0;
    int ofs = e[ch & 127].upper;
    return ofs == 0 ? 0 : &case_expansion[ofs];
}